

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O3

void __thiscall OpenMD::GB::addType(GB *this,AtomType *atomType)

{
  size_t sVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  AtomType *this_00;
  _Base_ptr p_Var12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pair<std::_Rb_tree_iterator<int>,_bool> pVar25;
  int atid;
  string DistanceMix;
  GayBerneAdapter gba2;
  GayBerneAdapter gba1;
  LennardJonesAdapter lja1;
  LennardJonesAdapter lja2;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  uint local_1bc;
  RealType local_1b8;
  string local_1b0;
  RealType local_190;
  RealType local_188;
  double local_180;
  locale local_178 [8];
  GayBerneAdapter local_170;
  double local_168;
  long local_160;
  GayBerneAdapter local_158;
  LennardJonesAdapter local_150;
  RealType local_148;
  undefined8 uStack_140;
  long local_138;
  long local_130;
  size_t local_128;
  _Rb_tree_node_base *local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  LennardJonesAdapter local_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double local_c8;
  double local_b8;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  
  local_1bc = AtomType::getIdent(atomType);
  sVar1 = (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar25 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->GBtypes,(int *)&local_1bc);
  if (pVar25.second == false) {
    snprintf(painCave.errMsg,2000,"GB already had a previous entry with ident %d\n",(ulong)local_1bc
            );
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_1bc] = (int)sVar1;
  lVar14 = (long)(int)sVar1;
  local_130 = lVar14 * 3;
  std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar14,(long)this->nGB_);
  local_158.at_ = atomType;
  local_150.at_ = atomType;
  bVar8 = GayBerneAdapter::isGayBerne(&local_158);
  local_128 = sVar1;
  if (bVar8) {
    local_1b8 = GayBerneAdapter::getD(&local_158);
    local_1f0 = GayBerneAdapter::getL(&local_158);
    local_188 = GayBerneAdapter::getEpsX(&local_158);
    local_1e8 = GayBerneAdapter::getEpsS(&local_158);
    local_1e0 = GayBerneAdapter::getEpsE(&local_158);
    local_190 = GayBerneAdapter::getDw(&local_158);
  }
  else {
    bVar8 = LennardJonesAdapter::isLennardJones(&local_150);
    if (bVar8) {
      local_1f0 = LennardJonesAdapter::getSigma(&local_150);
      local_1f0 = local_1f0 / 1.4142135623730951;
      local_1e8 = LennardJonesAdapter::getEpsilon(&local_150);
      local_190 = 1.0;
      local_1e0 = local_1e8;
      local_1b8 = local_1f0;
      local_188 = local_1e8;
    }
    else {
      AtomType::getName_abi_cxx11_(&local_1b0,atomType);
      snprintf(painCave.errMsg,2000,
               "GB::addType was passed an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
               ,local_1b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      local_190 = 0.0;
      local_188 = 0.0;
      local_1f0 = 0.0;
      local_1e8 = local_188;
      local_1e0 = local_188;
      local_1b8 = local_1f0;
    }
  }
  p_Var12 = (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_120 = &(this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var12 != local_120) {
    local_168 = local_1b8 * local_1b8;
    local_e8 = local_1f0 * local_1f0 - local_168;
    uStack_e0 = 0;
    local_138 = lVar14 * 0x50;
    do {
      local_160 = (long)(this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)p_Var12[1]._M_color];
      this_00 = ForceField::getAtomType(this->forceField_,p_Var12[1]._M_color);
      local_170.at_ = this_00;
      local_f0.at_ = this_00;
      bVar8 = GayBerneAdapter::isGayBerne(&local_170);
      if (bVar8) {
        local_1d0 = GayBerneAdapter::getD(&local_170);
        local_148 = GayBerneAdapter::getL(&local_170);
        uStack_140 = extraout_XMM0_Qb;
        local_200 = GayBerneAdapter::getEpsX(&local_170);
        local_1f8 = GayBerneAdapter::getEpsS(&local_170);
        local_1c8 = GayBerneAdapter::getEpsE(&local_170);
        local_1d8 = GayBerneAdapter::getDw(&local_170);
      }
      else {
        bVar8 = LennardJonesAdapter::isLennardJones(&local_f0);
        if (bVar8) {
          local_148 = LennardJonesAdapter::getSigma(&local_f0);
          local_148 = local_148 / 1.4142135623730951;
          uStack_140 = extraout_XMM0_Qb_00;
          local_200 = LennardJonesAdapter::getEpsilon(&local_f0);
          local_1d8 = 1.0;
          local_1d0 = local_148;
          local_1f8 = local_200;
          local_1c8 = local_200;
        }
        else {
          AtomType::getName_abi_cxx11_(&local_1b0,this_00);
          snprintf(painCave.errMsg,2000,
                   "GB::addType found an atomType (%s) that does not\n\tappear to be a Gay-Berne or Lennard-Jones atom.\n"
                   ,local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
          local_1d8 = 0.0;
          local_1c8 = 0.0;
          local_1f8 = 0.0;
          local_200 = 0.0;
          local_148 = 0.0;
          uStack_140 = 0;
          local_1d0 = 0.0;
        }
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar2 = (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar2,
                 pcVar2 + (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_.
                          _M_string_length);
      std::locale::locale(local_178);
      toUpper<std::__cxx11::string>(&local_1b0,local_178);
      std::locale::~locale(local_178);
      iVar11 = std::__cxx11::string::compare((char *)&local_1b0);
      local_f8 = local_1d0 * local_1d0;
      if (iVar11 == 0) {
        dVar5 = (local_1d0 + local_1b8) * 0.5;
      }
      else {
        dVar5 = SQRT(local_168 + local_f8);
      }
      dVar18 = (local_1d8 + local_190) * 0.5;
      dVar15 = local_200 * local_188;
      if (dVar15 < 0.0) {
        local_180 = sqrt(dVar15);
      }
      else {
        local_180 = SQRT(dVar15);
      }
      dVar15 = 1.0 / this->mu_;
      local_58 = pow(local_1e8,dVar15);
      local_68 = pow(local_1e0,dVar15);
      local_78 = pow(local_1e8,dVar15);
      local_88 = pow(local_1c8,dVar15);
      local_48 = pow(local_1f8,dVar15);
      local_98 = pow(local_1c8,dVar15);
      local_a8 = pow(local_1f8,dVar15);
      local_b8 = pow(local_1e0,dVar15);
      local_100 = pow(local_1e8,dVar15);
      local_108 = pow(local_1e0,dVar15);
      local_c8 = pow(local_1f8,dVar15);
      local_110 = pow(local_1c8,dVar15);
      dVar16 = pow(local_1f8,dVar15);
      local_118 = pow(local_1e0,dVar15);
      local_d8 = pow(local_1e8,dVar15);
      dVar15 = pow(local_1c8,dVar15);
      bVar8 = AtomType::isLennardJones(atomType);
      bVar9 = AtomType::isLennardJones(this_00);
      bVar10 = GayBerneAdapter::isGayBerne(&local_158);
      if ((bVar10) || (bVar10 = GayBerneAdapter::isGayBerne(&local_170), bVar10)) {
        lVar7 = local_160;
        std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::resize
                  ((this->MixingMap).
                   super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + local_160,(long)this->nGB_);
        dVar6 = local_1f0 * local_1f0 + local_f8;
        dVar19 = local_148 * local_148 - local_f8;
        auVar17._0_8_ = local_e8 * dVar19;
        auVar17._8_8_ = dVar19;
        dVar19 = local_148 * local_148 + local_168;
        auVar20._0_8_ = dVar19 * dVar6;
        auVar20._8_8_ = dVar19;
        auVar17 = divpd(auVar17,auVar20);
        auVar23._0_8_ = local_48 - local_98;
        auVar23._8_8_ = local_58 - local_68;
        auVar24._8_8_ = local_88 + local_78;
        auVar24._0_8_ = local_b8 + local_a8;
        auVar24 = divpd(auVar23,auVar24);
        auVar21._8_8_ = ((local_c8 - local_110) * (local_100 - local_108)) / (dVar16 + local_118);
        auVar21._0_8_ = local_e8;
        auVar22._8_4_ = SUB84(local_d8 + dVar15,0);
        auVar22._0_8_ = dVar6;
        auVar22._12_4_ = (int)((ulong)(local_d8 + dVar15) >> 0x20);
        auVar22 = divpd(auVar21,auVar22);
        lVar14 = *(long *)((long)&(((this->MixingMap).
                                    super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                                  )._M_impl.super__Vector_impl_data + local_130 * 8);
        lVar13 = local_160 * 0x50;
        *(double *)(lVar14 + lVar13) = dVar5;
        *(double *)(lVar14 + 8 + lVar13) = local_180;
        *(double *)(lVar14 + 0x10 + lVar13) = dVar18;
        *(long *)(lVar14 + 0x18 + lVar13) = auVar17._0_8_;
        auVar3._8_4_ = auVar17._8_4_;
        auVar3._0_8_ = auVar22._0_8_;
        auVar3._12_4_ = auVar17._12_4_;
        *(undefined1 (*) [16])(lVar14 + 0x20 + lVar13) = auVar3;
        auVar4._8_4_ = auVar24._8_4_;
        auVar4._0_8_ = auVar22._8_8_;
        auVar4._12_4_ = auVar24._12_4_;
        *(undefined1 (*) [16])(lVar14 + 0x30 + lVar13) = auVar4;
        *(long *)(lVar14 + 0x40 + lVar13) = auVar24._0_8_;
        *(bool *)(lVar14 + 0x48 + lVar13) = bVar8;
        *(bool *)(lVar14 + 0x49 + lVar13) = bVar9;
        if ((int)local_160 != (int)local_128) {
          lVar14 = *(long *)&(this->MixingMap).
                             super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar7].
                             super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                             ._M_impl.super__Vector_impl_data;
          *(double *)(lVar14 + local_138) = dVar5;
          *(double *)(lVar14 + 8 + local_138) = local_180;
          *(double *)(lVar14 + 0x10 + local_138) = dVar18;
          *(undefined1 (*) [16])(lVar14 + 0x18 + local_138) = auVar17;
          *(undefined1 (*) [16])(lVar14 + 0x28 + local_138) = auVar22;
          *(undefined1 (*) [16])(lVar14 + 0x38 + local_138) = auVar24;
          *(bool *)(lVar14 + 0x48 + local_138) = bVar9;
          *(bool *)(lVar14 + 0x49 + local_138) = bVar8;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != local_120);
  }
  return;
}

Assistant:

void GB::addType(AtomType* atomType) {
    // add it to the map:
    int atid  = atomType->getIdent();
    int gbtid = GBtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = GBtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    GBtids[atid] = gbtid;
    MixingMap[gbtid].resize(nGB_);

    RealType d1(0.0), l1(0.0), eX1(0.0), eS1(0.0), eE1(0.0), dw1(0.0);

    LennardJonesAdapter lja1 = LennardJonesAdapter(atomType);
    GayBerneAdapter gba1     = GayBerneAdapter(atomType);
    if (gba1.isGayBerne()) {
      d1  = gba1.getD();
      l1  = gba1.getL();
      eX1 = gba1.getEpsX();
      eS1 = gba1.getEpsS();
      eE1 = gba1.getEpsE();
      dw1 = gba1.getDw();
    } else if (lja1.isLennardJones()) {
      d1  = lja1.getSigma() / sqrt(2.0);
      l1  = d1;
      eX1 = lja1.getEpsilon();
      eS1 = eX1;
      eE1 = eX1;
      dw1 = 1.0;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GB::addType was passed an atomType (%s) that does not\n"
               "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = GBtypes.begin(); it != GBtypes.end(); ++it) {
      int gbtid2       = GBtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      LennardJonesAdapter lja2 = LennardJonesAdapter(atype2);
      GayBerneAdapter gba2     = GayBerneAdapter(atype2);
      RealType d2(0.0), l2(0.0), eX2(0.0), eS2(0.0), eE2(0.0), dw2(0.0);

      if (gba2.isGayBerne()) {
        d2  = gba2.getD();
        l2  = gba2.getL();
        eX2 = gba2.getEpsX();
        eS2 = gba2.getEpsS();
        eE2 = gba2.getEpsE();
        dw2 = gba2.getDw();
      } else if (lja2.isLennardJones()) {
        d2  = lja2.getSigma() / sqrt(2.0);
        l2  = d2;
        eX2 = lja2.getEpsilon();
        eS2 = eX2;
        eE2 = eX2;
        dw2 = 1.0;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "GB::addType found an atomType (%s) that does not\n"
                 "\tappear to be a Gay-Berne or Lennard-Jones atom.\n",
                 atype2->getName().c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      GBInteractionData mixer1, mixer2;

      //  Cleaver paper uses sqrt of squares to get sigma0 for
      //  mixed interactions.
      ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
      string DistanceMix       = fopts.getDistanceMixingRule();
      toUpper(DistanceMix);

      if (DistanceMix == "ARITHMETIC")
        mixer1.sigma0 = 0.5 * (d1 + d2);
      else
        mixer1.sigma0 = sqrt(d1 * d1 + d2 * d2);

      mixer1.xa2  = (l1 * l1 - d1 * d1) / (l1 * l1 + d2 * d2);
      mixer1.xai2 = (l2 * l2 - d2 * d2) / (l2 * l2 + d1 * d1);
      mixer1.x2   = (l1 * l1 - d1 * d1) * (l2 * l2 - d2 * d2) /
                  ((l2 * l2 + d1 * d1) * (l1 * l1 + d2 * d2));

      mixer2.sigma0 = mixer1.sigma0;
      // xa2 and xai2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xa2  = mixer1.xai2;
      mixer2.xai2 = mixer1.xa2;
      mixer2.x2   = mixer1.x2;

      // assumed LB mixing rules for now:

      mixer1.dw   = 0.5 * (dw1 + dw2);
      mixer1.eps0 = sqrt(eX1 * eX2);

      mixer2.dw   = mixer1.dw;
      mixer2.eps0 = mixer1.eps0;

      RealType mi = RealType(1.0) / mu_;

      mixer1.xpap2 =
          (pow(eS1, mi) - pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));
      mixer1.xpapi2 =
          (pow(eS2, mi) - pow(eE2, mi)) / (pow(eS2, mi) + pow(eE1, mi));
      mixer1.xp2 =
          (pow(eS1, mi) - pow(eE1, mi)) * (pow(eS2, mi) - pow(eE2, mi)) /
          (pow(eS2, mi) + pow(eE1, mi)) / (pow(eS1, mi) + pow(eE2, mi));

      // xpap2 and xpapi2 for j-i pairs are reversed from the same i-j pairing.
      // Swapping the particles reverses the anisotropy parameters:
      mixer2.xpap2  = mixer1.xpapi2;
      mixer2.xpapi2 = mixer1.xpap2;
      mixer2.xp2    = mixer1.xp2;
      // keep track of who is the LJ atom:
      mixer1.i_is_LJ = atomType->isLennardJones();
      mixer1.j_is_LJ = atype2->isLennardJones();
      mixer2.i_is_LJ = mixer1.j_is_LJ;
      mixer2.j_is_LJ = mixer1.i_is_LJ;

      // only add this pairing if at least one of the atoms is a Gay-Berne atom

      if (gba1.isGayBerne() || gba2.isGayBerne()) {
        MixingMap[gbtid2].resize(nGB_);
        MixingMap[gbtid][gbtid2] = mixer1;
        if (gbtid2 != gbtid) { MixingMap[gbtid2][gbtid] = mixer2; }
      }
    }
  }